

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPAddress.h
# Opt level: O2

bool __thiscall flow::util::IPAddress::set(IPAddress *this,string *text,Family family)

{
  int iVar1;
  
  this->family_ = family;
  iVar1 = inet_pton(family,(text->_M_dataplus)._M_p,this->buf_);
  if (iVar1 < 1) {
    if (iVar1 < 0) {
      perror("inet_pton");
    }
    else {
      fprintf(_stderr,"IP address Not in presentation format: %s\n",(text->_M_dataplus)._M_p);
    }
    this->cstr_[0] = '\0';
  }
  else {
    strncpy(this->cstr_,(text->_M_dataplus)._M_p,0x2e);
  }
  return 0 < iVar1;
}

Assistant:

inline bool IPAddress::set(const std::string& text, Family family) {
  family_ = family;
  int rv = inet_pton(static_cast<int>(family), text.c_str(), buf_);
  if (rv <= 0) {
    if (rv < 0)
      perror("inet_pton");
    else
      fprintf(stderr, "IP address Not in presentation format: %s\n",
              text.c_str());

    cstr_[0] = 0;
    return false;
  }

#if defined(_WIN32) || defined(_WIN64)
  strncpy_s(cstr_, sizeof(cstr_), text.c_str(), text.size());
#else
  strncpy(cstr_, text.c_str(), sizeof(cstr_));
#endif

  return true;
}